

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statements.cpp
# Opt level: O0

void __thiscall
hsql::PrepareStatement::setPlaceholders
          (PrepareStatement *this,vector<void_*,_std::allocator<void_*>_> *ph)

{
  bool bVar1;
  reference ppvVar2;
  iterator iVar3;
  iterator iVar4;
  size_type sVar5;
  reference ppEVar6;
  ulong local_60;
  uintmax_t i;
  value_type local_40;
  value_type local_38;
  void *e;
  iterator __end1;
  iterator __begin1;
  vector<void_*,_std::allocator<void_*>_> *__range1;
  vector<void_*,_std::allocator<void_*>_> *ph_local;
  PrepareStatement *this_local;
  
  __end1 = std::vector<void_*,_std::allocator<void_*>_>::begin(ph);
  e = (void *)std::vector<void_*,_std::allocator<void_*>_>::end(ph);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                                *)&e);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&__end1);
    local_38 = (value_type)*ppvVar2;
    if (local_38 != (value_type)0x0) {
      local_40 = local_38;
      std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::push_back
                (&this->placeholders,&local_40);
    }
    __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::operator++
              (&__end1);
  }
  iVar3 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::begin(&this->placeholders);
  iVar4 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::end(&this->placeholders);
  std::
  sort<__gnu_cxx::__normal_iterator<hsql::Expr**,std::vector<hsql::Expr*,std::allocator<hsql::Expr*>>>,hsql::PrepareStatement::setPlaceholders(std::vector<void*,std::allocator<void*>>)::__0>
            (iVar3._M_current,iVar4._M_current);
  local_60 = 0;
  while( true ) {
    sVar5 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::size(&this->placeholders);
    if (sVar5 <= local_60) break;
    ppEVar6 = std::vector<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>::operator[]
                        (&this->placeholders,local_60);
    (*ppEVar6)->ival = local_60;
    local_60 = local_60 + 1;
  }
  return;
}

Assistant:

void PrepareStatement::setPlaceholders(std::vector<void*> ph) {
    for (void* e : ph) {
      if (e != NULL)
        placeholders.push_back((Expr*) e);
    }
    // Sort by col-id
    std::sort(placeholders.begin(), placeholders.end(), [](Expr * i, Expr * j) -> bool { return (i->ival < j->ival); });

    // Set the placeholder id on the Expr. This replaces the previously stored column id
    for (uintmax_t i = 0; i < placeholders.size(); ++i) placeholders[i]->ival = i;
  }